

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool hasSuffix(string *Str,string *Suffix)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  string *psVar6;
  string *Suffix_local;
  string *Str_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar2 = std::__cxx11::string::length();
    uVar3 = std::__cxx11::string::length();
    if (uVar2 < uVar3) {
      Str_local._7_1_ = false;
    }
    else {
      lVar4 = std::__cxx11::string::length();
      lVar5 = std::__cxx11::string::length();
      psVar6 = (string *)std::__cxx11::string::length();
      iVar1 = std::__cxx11::string::compare((ulong)Str,lVar4 - lVar5,psVar6);
      Str_local._7_1_ = iVar1 == 0;
    }
  }
  else {
    Str_local._7_1_ = true;
  }
  return Str_local._7_1_;
}

Assistant:

bool hasSuffix(std::string const &Str, std::string const &Suffix) {
  if (Suffix.empty())
    return true;
  if (Str.length() >= Suffix.length())
    return (Str.compare(Str.length() - Suffix.length(), Suffix.length(),
                        Suffix) == 0);
  else
    return false;
}